

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimaleglscreen.cpp
# Opt level: O0

QRect __thiscall QMinimalEglScreen::geometry(QMinimalEglScreen *this)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QRect *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRect::isNull(in_stack_ffffffffffffffd0);
  if (bVar2) {
    createAndSetPlatformContext((QMinimalEglScreen *)0x1081de);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(QRect *)(in_RDI + 0x10);
}

Assistant:

QRect QMinimalEglScreen::geometry() const
{
    if (m_geometry.isNull()) {
        createAndSetPlatformContext();
    }
    return m_geometry;
}